

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_wipe.cpp
# Opt level: O1

bool wipe_doMelt(int ticks)

{
  int iVar1;
  int iVar2;
  BYTE *pBVar3;
  int iVar4;
  short *psVar5;
  short *psVar6;
  int *piVar7;
  DFrameBuffer *pDVar8;
  bool bVar9;
  int iVar10;
  short *psVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  short *psVar15;
  long lVar16;
  long lVar17;
  short *psVar18;
  long lVar19;
  short *psVar20;
  
  piVar7 = y;
  psVar6 = wipe_scr_end;
  psVar5 = wipe_scr_start;
  if (ticks == 0) {
    bVar9 = true;
  }
  else {
    do {
      pDVar8 = screen;
      ticks = ticks + -1;
      bVar9 = true;
      lVar14 = 0;
      do {
        iVar1 = piVar7[lVar14];
        if (iVar1 < 0) {
          iVar10 = iVar1 + 1;
LAB_003846ab:
          piVar7[lVar14] = iVar10;
          bVar9 = false;
        }
        else if (iVar1 < 200) {
          iVar10 = iVar1 + 1;
          if (0xf < iVar1) {
            iVar10 = 8;
          }
          iVar10 = iVar10 + iVar1;
          if (199 < iVar10) {
            iVar10 = 200;
          }
          goto LAB_003846ab;
        }
        if ((ticks == 0) && (-1 < piVar7[lVar14])) {
          iVar10 = (pDVar8->super_DSimpleCanvas).super_DCanvas.Width / 2;
          iVar1 = (iVar10 * (int)lVar14) / 0xa0;
          iVar10 = (((int)lVar14 + 1) * iVar10) / 0xa0;
          if (iVar1 < iVar10) {
            iVar2 = (pDVar8->super_DSimpleCanvas).super_DCanvas.Height;
            lVar17 = (long)iVar2;
            iVar12 = piVar7[lVar14] * iVar2;
            iVar4 = iVar12 / 200;
            iVar13 = (pDVar8->super_DSimpleCanvas).super_DCanvas.Pitch / 2;
            pBVar3 = (pDVar8->super_DSimpleCanvas).super_DCanvas.Buffer;
            lVar16 = (long)iVar1;
            psVar11 = (short *)(pBVar3 + lVar16 * 2);
            lVar19 = lVar17 * 2 * lVar16;
            psVar18 = (short *)((long)psVar6 + lVar19);
            psVar20 = (short *)(lVar19 + (long)psVar5);
            do {
              if (iVar12 + 199U < 399) {
                psVar15 = (short *)(pBVar3 + lVar16 * 2);
              }
              else {
                lVar19 = 0;
                psVar15 = psVar11;
                do {
                  *psVar15 = psVar18[lVar19];
                  psVar15 = psVar15 + iVar13;
                  lVar19 = lVar19 + 1;
                } while (iVar4 != (int)lVar19);
              }
              if (iVar2 != iVar4) {
                lVar19 = 0;
                do {
                  *psVar15 = psVar20[lVar19];
                  psVar15 = psVar15 + iVar13;
                  lVar19 = lVar19 + 1;
                } while (iVar2 - iVar4 != (int)lVar19);
              }
              lVar16 = lVar16 + 1;
              psVar11 = psVar11 + 1;
              psVar18 = psVar18 + lVar17;
              psVar20 = psVar20 + lVar17;
            } while (lVar16 != iVar10);
          }
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0xa0);
    } while (ticks != 0);
  }
  return bVar9;
}

Assistant:

bool wipe_doMelt (int ticks)
{
	int i, j, dy, x;
	const short *s;
	short *d;
	bool done = true;

	while (ticks--)
	{
		done = true;
		for (i = 0; i < MELT_WIDTH; i++)
		{
			if (y[i] < 0)
			{
				y[i]++;
				done = false;
			} 
			else if (y[i] < MELT_HEIGHT)
			{
				dy = (y[i] < 16) ? y[i]+1 : 8;
				y[i] = MIN(y[i] + dy, MELT_HEIGHT);
				done = false;
			}
			if (ticks == 0 && y[i] >= 0)
			{ // Only draw for the final tick.
				const int pitch = screen->GetPitch() / 2;
				int sy = y[i] * SCREENHEIGHT / MELT_HEIGHT;

				for (x = i * (SCREENWIDTH/2) / MELT_WIDTH; x < (i + 1) * (SCREENWIDTH/2) / MELT_WIDTH; ++x)
				{
					s = &wipe_scr_end[x*SCREENHEIGHT];
					d = &((short *)screen->GetBuffer())[x];

					for (j = sy; j != 0; --j)
					{
						*d = *(s++);
						d += pitch;
					}

					s = &wipe_scr_start[x*SCREENHEIGHT];

					for (j = SCREENHEIGHT - sy; j != 0; --j)
					{
						*d = *(s++);
						d += pitch;
					}
				}
			}
		}
	}

	return done;
}